

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O3

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::run(QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
      *this,QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_target_put_count)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ostream *poVar3;
  size_t i_max_size;
  size_t i_max_size_00;
  size_t i_max_size_01;
  ScopedLeakCheck objecty_leak_check;
  string local_58;
  EasyRandom *local_38;
  
  poVar3 = *(ostream **)this;
  local_38 = i_random;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"starting queue generic test with ",0x21);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," threads and ",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>(*(ulong *)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," total puts",0xb);
  poVar3 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nheterogeneous_queue: ",0x16);
  truncated_type_name<density::lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>>
            (&local_58,(density_tests *)0x50,i_max_size);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  poVar3 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nruntime_type: ",0xf);
  truncated_type_name<density::runtime_type<>>(&local_58,(density_tests *)0x50,i_max_size_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  poVar3 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nallocator_type: ",0x11);
  truncated_type_name<density_tests::UnmovableFastTestAllocator<65536ul>>
            (&local_58,(density_tests *)0x50,i_max_size_01);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  poVar3 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\npage_alignment: ",0x11);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\npage_size: ",0xc);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nconc puts: ",0xc);
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t\t\tconc consume: ",0x11);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nconc put-consumes: ",0x14);
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t\t\tis_seq_cst: ",0xf);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nwith_exceptions: ",0x12);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  cVar2 = (char)*(long **)this;
  std::ios::widen((char)*(undefined8 *)(**(long **)this + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  InstanceCounted::ScopedLeakCheck::ScopedLeakCheck((ScopedLeakCheck *)&local_58);
  run_impl(this,i_flags,local_38,i_target_put_count);
  poVar3 = *(ostream **)this;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"--------------------------------------------\n",0x2d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  InstanceCounted::ScopedLeakCheck::~ScopedLeakCheck((ScopedLeakCheck *)&local_58);
  return;
}

Assistant:

void run(QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_target_put_count) const
        {
            bool const with_exceptions =
              (i_flags & QueueTesterFlags::eTestExceptions) != QueueTesterFlags::eNone;

            m_output << "starting queue generic test with " << m_thread_count << " threads and ";
            m_output << i_target_put_count << " total puts";
            m_output << "\nheterogeneous_queue: " << truncated_type_name<QUEUE>();
            m_output << "\nruntime_type: " << truncated_type_name<typename QUEUE::runtime_type>();
            m_output << "\nallocator_type: "
                     << truncated_type_name<typename QUEUE::allocator_type>();
            m_output << "\npage_alignment: " << QUEUE::allocator_type::page_alignment;
            m_output << "\npage_size: " << QUEUE::allocator_type::page_size;
            m_output << "\nconc puts: " << QUEUE::concurrent_puts
                     << "\t\t\tconc consume: " << QUEUE::concurrent_consumes;
            m_output << "\nconc put-consumes: " << QUEUE::concurrent_put_consumes
                     << "\t\t\tis_seq_cst: " << QUEUE::is_seq_cst;
            m_output << "\nwith_exceptions: " << with_exceptions;
            m_output << std::endl;

            InstanceCounted::ScopedLeakCheck objecty_leak_check;
            run_impl(i_flags, i_random, i_target_put_count);

            m_output << "--------------------------------------------\n" << std::endl;
        }